

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopengltextureblitter.cpp
# Opt level: O0

void __thiscall
QOpenGLTextureBlitterPrivate::blit
          (QOpenGLTextureBlitterPrivate *this,GLuint texture,QMatrix4x4 *targetTransform,
          Origin origin)

{
  bool bVar1;
  ProgramIndex PVar2;
  QOpenGLFunctions *this_00;
  float *pfVar3;
  int in_ECX;
  QOpenGLFunctions *pQVar4;
  QOpenGLTextureBlitterPrivate *in_RDX;
  undefined4 in_ESI;
  QOpenGLFunctions *in_RDI;
  long in_FS_OFFSET;
  Program *program;
  QBlitterTextureBinder binder;
  QMatrix3x3 textureTransform_1;
  QMatrix3x3 textureTransform;
  QMatrix3x3 sourceTransform;
  undefined8 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff40;
  int iVar5;
  undefined4 in_stack_ffffffffffffff50;
  undefined1 local_74 [36];
  undefined1 local_50 [36];
  QGenericMatrix<3,_3,_float> local_2c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QBlitterTextureBinder::QBlitterTextureBinder
            ((QBlitterTextureBinder *)in_RDI,(GLenum)((ulong)in_stack_ffffffffffffff28 >> 0x20),
             (GLuint)in_stack_ffffffffffffff28);
  bVar1 = prepareProgram(in_RDX,(QMatrix4x4 *)CONCAT44(in_ECX,in_stack_ffffffffffffff40));
  if (bVar1) {
    pQVar4 = in_RDI + 0x18;
    PVar2 = targetToProgramIndex((GLenum)pQVar4);
    this_00 = pQVar4 + (ulong)PVar2 * 0x30;
    if (in_ECX == 1) {
      if (*(int *)(this_00 + 0x28) != 2) {
        memset(&local_2c,0xff,0x24);
        QGenericMatrix<3,_3,_float>::QGenericMatrix((QGenericMatrix<3,_3,_float> *)0x19d003);
        pfVar3 = QGenericMatrix<3,_3,_float>::operator()(&local_2c,1,1);
        *pfVar3 = -1.0;
        pfVar3 = QGenericMatrix<3,_3,_float>::operator()(&local_2c,1,2);
        *pfVar3 = 1.0;
        memset(local_50,0xff,0x24);
        toTextureCoordinates(in_RDX,(QMatrix3x3 *)CONCAT44(in_ECX,in_stack_ffffffffffffff40));
        iVar5 = (int)((ulong)in_RDX >> 0x20);
        QScopedPointer<QOpenGLShaderProgram,_QScopedPointerDeleter<QOpenGLShaderProgram>_>::
        operator->((QScopedPointer<QOpenGLShaderProgram,_QScopedPointerDeleter<QOpenGLShaderProgram>_>
                    *)this_00);
        QOpenGLShaderProgram::setUniformValue
                  ((QOpenGLShaderProgram *)CONCAT44(in_ESI,in_stack_ffffffffffffff50),iVar5,
                   (QMatrix3x3 *)CONCAT44(in_ECX,in_stack_ffffffffffffff40));
        *(undefined4 *)(this_00 + 0x28) = 2;
      }
    }
    else if (*(int *)(this_00 + 0x28) != 1) {
      memset(local_74,0xff,0x24);
      QGenericMatrix<3,_3,_float>::QGenericMatrix((QGenericMatrix<3,_3,_float> *)0x19d0d0);
      toTextureCoordinates(in_RDX,(QMatrix3x3 *)CONCAT44(in_ECX,in_stack_ffffffffffffff40));
      iVar5 = (int)((ulong)in_RDX >> 0x20);
      QScopedPointer<QOpenGLShaderProgram,_QScopedPointerDeleter<QOpenGLShaderProgram>_>::operator->
                ((QScopedPointer<QOpenGLShaderProgram,_QScopedPointerDeleter<QOpenGLShaderProgram>_>
                  *)this_00);
      QOpenGLShaderProgram::setUniformValue
                ((QOpenGLShaderProgram *)CONCAT44(in_ESI,in_stack_ffffffffffffff50),iVar5,
                 (QMatrix3x3 *)CONCAT44(in_ECX,in_stack_ffffffffffffff40));
      *(undefined4 *)(this_00 + 0x28) = 1;
    }
    QOpenGLContext::currentContext();
    QOpenGLContext::functions();
    QOpenGLFunctions::glDrawArrays(in_RDI,(GLenum)((ulong)pQVar4 >> 0x20),(GLint)pQVar4,0);
  }
  QBlitterTextureBinder::~QBlitterTextureBinder((QBlitterTextureBinder *)in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QOpenGLTextureBlitterPrivate::blit(GLuint texture,
                                        const QMatrix4x4 &targetTransform,
                                        QOpenGLTextureBlitter::Origin origin)
{
    QBlitterTextureBinder binder(currentTarget, texture);
    if (!prepareProgram(targetTransform))
        return;

    Program *program = &programs[targetToProgramIndex(currentTarget)];

    if (origin == QOpenGLTextureBlitter::OriginTopLeft) {
        if (program->textureMatrixUniformState != IdentityFlipped) {
            QMatrix3x3 sourceTransform;
            sourceTransform(1,1) = -1;
            sourceTransform(1,2) = 1;
            const QMatrix3x3 textureTransform = toTextureCoordinates(sourceTransform);
            program->glProgram->setUniformValue(program->textureTransformUniformPos, textureTransform);
            program->textureMatrixUniformState = IdentityFlipped;
        }
    } else if (program->textureMatrixUniformState != Identity) {
        const QMatrix3x3 textureTransform = toTextureCoordinates(QMatrix3x3());
        program->glProgram->setUniformValue(program->textureTransformUniformPos, textureTransform);
        program->textureMatrixUniformState = Identity;
    }

    QOpenGLContext::currentContext()->functions()->glDrawArrays(GL_TRIANGLES, 0, 6);
}